

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void wtree_summary(wtree_object wt)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = wt->J;
  wave_summary(wt->wave);
  putchar(10);
  printf("Wavelet Transform : %s \n",wt->method);
  putchar(10);
  printf("Signal Extension : %s \n",wt->ext);
  putchar(10);
  printf("Number of Decomposition Levels %d \n",(ulong)(uint)wt->J);
  putchar(10);
  printf("Length of Input Signal %d \n",(ulong)(uint)wt->siglength);
  putchar(10);
  printf("Length of WT Output Vector %d \n",(ulong)(uint)wt->outlength);
  putchar(10);
  printf("Wavelet Coefficients are contained in vector : %s \n","output");
  putchar(10);
  puts("Coefficients Access ");
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  uVar2 = 2;
  uVar7 = 0;
  lVar5 = 0;
  while (uVar7 != uVar3) {
    lVar6 = (long)(int)uVar1 - uVar7;
    uVar7 = uVar7 + 1;
    lVar5 = (long)(int)lVar5;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      printf("Node %d %d Access : output[%d] Length : %d \n",uVar7 & 0xffffffff,(ulong)uVar4,
             (ulong)(uint)wt->nodelength[lVar5],(ulong)*(uint *)((long)wt + lVar6 * 4 + 0x50));
      lVar5 = lVar5 + 1;
    }
    uVar2 = uVar2 * 2;
  }
  putchar(10);
  return;
}

Assistant:

void wtree_summary(wtree_object wt) {
	int i,k,p2;
	int J,t;
	J = wt->J;
	wave_summary(wt->wave);
	printf("\n");
	printf("Wavelet Transform : %s \n", wt->method);
	printf("\n");
	printf("Signal Extension : %s \n", wt->ext);
	printf("\n");
	printf("Number of Decomposition Levels %d \n", wt->J);
	printf("\n");
	printf("Length of Input Signal %d \n", wt->siglength);
	printf("\n");
	printf("Length of WT Output Vector %d \n", wt->outlength);
	printf("\n");
	printf("Wavelet Coefficients are contained in vector : %s \n", "output");
	printf("\n");
	printf("Coefficients Access \n");
	t = 0;
	p2 = 2;
	for (i = 0; i < J; ++i) {
		for (k = 0; k < p2; ++k) {
			printf("Node %d %d Access : output[%d] Length : %d \n", i + 1, k, wt->nodelength[t], wt->length[J - i]);
			t++;
		}
		p2 *= 2;
	}
	printf("\n");

}